

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_iterator.hpp
# Opt level: O2

void __thiscall
boost::iterators::
filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::filter_iterator(filter_iterator<boost::xpressive::detail::filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::xpressive::detail::weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *this,filter_self<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        f,weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *x,
                 weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *end_)

{
  sp_counted_base *psVar1;
  set_type *psVar2;
  
  (this->super_type).m_iterator.cur_.px = (x->cur_).px;
  psVar1 = (x->cur_).pn.pi_;
  (this->super_type).m_iterator.cur_.pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->use_count_ = psVar1->use_count_ + 1;
    UNLOCK();
  }
  psVar2 = x->set_;
  (this->super_type).m_iterator.iter_._M_node = (x->iter_)._M_node;
  (this->super_type).m_iterator.set_ = psVar2;
  (this->m_predicate).self_ = f.self_;
  psVar1 = (end_->cur_).pn.pi_;
  (this->m_end).cur_.px = (end_->cur_).px;
  (this->m_end).cur_.pn.pi_ = psVar1;
  (end_->cur_).px = (element_type *)0x0;
  (end_->cur_).pn.pi_ = (sp_counted_base *)0x0;
  psVar2 = end_->set_;
  (this->m_end).iter_._M_node = (end_->iter_)._M_node;
  (this->m_end).set_ = psVar2;
  satisfy_predicate(this);
  return;
}

Assistant:

filter_iterator(Predicate f, Iterator x, Iterator end_ = Iterator())
          : super_t(BOOST_ITERATOR_DETAIL_MOVE(Iterator, x)), m_predicate(BOOST_ITERATOR_DETAIL_MOVE(Predicate, f)), m_end(BOOST_ITERATOR_DETAIL_MOVE(Iterator, end_))
      {
          satisfy_predicate();
      }